

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O0

bool __thiscall draco::ObjEncoder::EncodeTextureCoordinates(ObjEncoder *this)

{
  bool bVar1;
  uint uVar2;
  PointAttribute *this_00;
  size_t sVar3;
  ObjEncoder *in_RDI;
  AttributeValueIndex i;
  array<float,_2UL> value;
  PointAttribute *att;
  undefined4 in_stack_ffffffffffffffb8;
  Type in_stack_ffffffffffffffbc;
  PointCloud *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> in_stack_ffffffffffffffdc;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> IVar4;
  void *in_stack_ffffffffffffffe0;
  PointAttribute *this_01;
  
  this_00 = PointCloud::GetNamedAttribute(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  if ((this_00 != (PointAttribute *)0x0) && (sVar3 = PointAttribute::size(this_00), sVar3 != 0)) {
    IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType
              ((IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
               &stack0xffffffffffffffdc,0);
    while( true ) {
      sVar3 = PointAttribute::size(this_00);
      uVar2 = (uint)sVar3;
      bVar1 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator<
                        ((IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                         &stack0xffffffffffffffdc,(uint *)&stack0xffffffffffffffd8);
      if (!bVar1) {
        ((DataBufferDescriptor *)&in_RDI->tex_coord_att_)->buffer_id = (int64_t)this_00;
        return true;
      }
      IVar4.value_ = in_stack_ffffffffffffffdc.value_;
      this_01 = this_00;
      std::array<float,_2UL>::operator[]
                ((array<float,_2UL> *)this_00,
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      bVar1 = GeometryAttribute::ConvertValue<float,2>
                        ((GeometryAttribute *)in_RDI,
                         (AttributeValueIndex)in_stack_ffffffffffffffdc.value_,(float *)this_00);
      if (!bVar1) break;
      buffer(in_RDI);
      EncoderBuffer::Encode
                ((EncoderBuffer *)this_01,in_stack_ffffffffffffffe0,CONCAT44(IVar4.value_,uVar2));
      std::array<float,_2UL>::operator[]
                ((array<float,_2UL> *)this_00,
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      EncodeFloatList((ObjEncoder *)
                      CONCAT44(in_stack_ffffffffffffffdc.value_,in_stack_ffffffffffffffd0),
                      (float *)in_RDI,(int)((ulong)this_00 >> 0x20));
      buffer(in_RDI);
      EncoderBuffer::Encode
                ((EncoderBuffer *)this_01,in_stack_ffffffffffffffe0,CONCAT44(IVar4.value_,uVar2));
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator++
                ((IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                 &stack0xffffffffffffffdc);
      in_stack_ffffffffffffffdc.value_ = IVar4.value_;
      this_00 = this_01;
    }
    return false;
  }
  return true;
}

Assistant:

bool ObjEncoder::EncodeTextureCoordinates() {
  const PointAttribute *const att =
      in_point_cloud_->GetNamedAttribute(GeometryAttribute::TEX_COORD);
  if (att == nullptr || att->size() == 0) {
    return true;  // It's OK if we don't have texture coordinates.
  }
  std::array<float, 2> value;
  for (AttributeValueIndex i(0); i < static_cast<uint32_t>(att->size()); ++i) {
    if (!att->ConvertValue<float, 2>(i, &value[0])) {
      return false;
    }
    buffer()->Encode("vt ", 3);
    EncodeFloatList(&value[0], 2);
    buffer()->Encode("\n", 1);
  }
  tex_coord_att_ = att;
  return true;
}